

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

void __thiscall cpptempl::data_ptr::push_back(data_ptr *this,data_ptr *data)

{
  bool bVar1;
  data_list *items;
  DataList *this_00;
  element_type *peVar2;
  long in_RDI;
  data_list *list;
  DataList *in_stack_ffffffffffffffa8;
  __shared_ptr<cpptempl::Data,_(__gnu_cxx::_Lock_policy)2> *in_stack_ffffffffffffffb0;
  __shared_ptr<cpptempl::Data,_(__gnu_cxx::_Lock_policy)2> local_28;
  undefined8 local_18;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 8));
  if (!bVar1) {
    items = (data_list *)(in_RDI + 8);
    this_00 = (DataList *)operator_new(0x20);
    local_28._M_ptr = (element_type *)0x0;
    local_28._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_18 = 0;
    in_stack_ffffffffffffffb0 = &local_28;
    in_stack_ffffffffffffffa8 = this_00;
    std::vector<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_>::vector
              ((vector<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_> *)0x1fe33f);
    DataList::DataList(this_00,items);
    std::__shared_ptr<cpptempl::Data,_(__gnu_cxx::_Lock_policy)2>::reset<cpptempl::DataList>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    std::vector<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_>::~vector
              ((vector<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_> *)
               in_stack_ffffffffffffffb0);
  }
  peVar2 = std::__shared_ptr_access<cpptempl::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cpptempl::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1fe3b1);
  (*peVar2->_vptr_Data[2])();
  std::vector<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_>::push_back
            ((vector<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_> *)
             in_stack_ffffffffffffffb0,(value_type *)in_stack_ffffffffffffffa8);
  return;
}

Assistant:

inline void data_ptr::push_back(const data_ptr& data) {
        if (!ptr) {
            ptr.reset(new DataList(data_list()));
        }
        data_list& list = ptr->getlist();
        list.push_back(data);
    }